

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O2

void __thiscall
rigtorp::mpmc::
Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
::~Queue(Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
         *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  while( true ) {
    if (this->capacity_ <= uVar2) break;
    Slot<std::unique_ptr<int,_std::default_delete<int>_>_>::~Slot
              ((Slot<std::unique_ptr<int,_std::default_delete<int>_>_> *)
               ((long)&(this->slots_->turn).super___atomic_base<unsigned_long>._M_i + lVar1));
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 0x40;
  }
  __gnu_cxx::new_allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>::
  deallocate((new_allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>
              *)this,this->slots_,this->capacity_ + 1);
  return;
}

Assistant:

~Queue() noexcept {
    for (size_t i = 0; i < capacity_; ++i) {
      slots_[i].~Slot();
    }
    allocator_.deallocate(slots_, capacity_ + 1);
  }